

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

module_ * __thiscall
pybind11::module_::
def<bool(*)(char_const*,int,int,ImVec2_const&,float),pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
          (module_ *this,char *name_,_func_bool_char_ptr_int_int_ImVec2_ptr_float **f,arg *extra,
          arg *extra_1,arg_v *extra_2,arg_v *extra_3,arg_v *extra_4)

{
  _func_bool_char_ptr_int_int_ImVec2_ptr_float *f_00;
  handle local_68;
  cpp_function func;
  object local_58;
  arg *local_50;
  handle local_48;
  name local_40;
  sibling local_38;
  
  f_00 = *f;
  local_48.m_ptr = (this->super_object).super_handle.m_ptr;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50 = extra_1;
  local_40.value = name_;
  local_68.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_68.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_68.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_38.value.m_ptr = (handle)(handle)local_68.m_ptr;
  cpp_function::
  cpp_function<bool,char_const*,int,int,ImVec2_const&,float,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg_v,pybind11::arg_v,pybind11::arg_v>
            (&func,f_00,&local_40,(scope *)&local_48,&local_38,extra,local_50,extra_2,extra_3,
             extra_4);
  object::~object((object *)&local_68);
  object::~object(&local_58);
  add_object(this,name_,(handle)func.super_function.super_object.super_handle.m_ptr,true);
  object::~object((object *)&func);
  return this;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra& ... extra) {
        cpp_function func(std::forward<Func>(f), name(name_), scope(*this),
                          sibling(getattr(*this, name_, none())), extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }